

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O3

void test_cpp_copy_map_iterator_to_different_map(void **param_1)

{
  unsigned_long b;
  initializer_list<unsigned_long> l;
  initializer_list<unsigned_long> l_00;
  Roaring64MapSetBitBiDirectionalIterator it;
  Roaring64Map m2;
  Roaring64Map m1;
  Roaring64MapSetBitBiDirectionalIterator local_f8;
  Roaring64Map local_b8;
  Roaring64Map local_80;
  Roaring64MapSetBitBiDirectionalIterator local_48;
  
  local_b8.roarings._M_t._M_impl._0_8_ = 1;
  l._M_len = 1;
  l._M_array = (iterator)&local_b8;
  roaring::Roaring64Map::Roaring64Map(&local_80,l);
  local_f8.i.parent = (roaring_bitmap_t *)0x1e;
  local_f8.i.container = (container_s *)0x28;
  local_f8.p = (map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                *)0xa;
  local_f8.map_iter._M_node = (_Base_ptr)0x14;
  l_00._M_len = 4;
  l_00._M_array = (iterator)&local_f8;
  roaring::Roaring64Map::Roaring64Map(&local_b8,l_00);
  roaring::Roaring64MapSetBitBiDirectionalIterator::Roaring64MapSetBitBiDirectionalIterator
            (&local_f8,&local_80,false);
  roaring::Roaring64MapSetBitBiDirectionalIterator::Roaring64MapSetBitBiDirectionalIterator
            (&local_48,&local_b8,false);
  local_f8.i.current_value = local_48.i.current_value;
  local_f8.i.has_value = local_48.i.has_value;
  local_f8.i._37_3_ = local_48.i._37_3_;
  local_f8.i.typecode = local_48.i.typecode;
  local_f8.i._17_3_ = local_48.i._17_3_;
  local_f8.i.container_index = local_48.i.container_index;
  local_f8.i.highbits = local_48.i.highbits;
  local_f8.i.container_it.index = local_48.i.container_it.index;
  local_f8.i.parent = local_48.i.parent;
  local_f8.i.container = local_48.i.container;
  local_f8.p = local_48.p;
  local_f8.map_iter._M_node = local_48.map_iter._M_node;
  local_48.p = (map<unsigned_int,_roaring::Roaring,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                *)0x15;
  roaring::Roaring64MapSetBitBiDirectionalIterator::move_equalorlarger
            (&local_f8,(value_type *)&local_48);
  if ((_Rb_tree_header *)local_f8.map_iter._M_node ==
      &((local_f8.p)->_M_t)._M_impl.super__Rb_tree_header) {
    b = 0;
  }
  else {
    b = 0;
    do {
      roaring::Roaring64MapSetBitBiDirectionalIterator::operator++(&local_f8);
      b = b + 1;
    } while ((_Rb_tree_header *)local_f8.map_iter._M_node !=
             &((local_f8.p)->_M_t)._M_impl.super__Rb_tree_header);
  }
  _assert_int_equal(2,b,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                    ,0x870);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_b8);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_80);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_copy_map_iterator_to_different_map) {
    Roaring64Map m1{1};
    Roaring64Map m2{10, 20, 30, 40};
    auto it = m1.begin();
    it = m2.begin();
    it.move_equalorlarger(21);
    int n = 0;
    for (; it != m2.end(); ++it, ++n) {
    }
    assert_int_equal(2, n);
}